

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::AtomicClearBits(atomic<long> *pv,intptr_t bits,intptr_t wait_until_clear)

{
  intptr_t iVar1;
  bool bVar2;
  atomic<long> *paVar3;
  atomic<long> *local_70;
  intptr_t v;
  intptr_t wait_until_clear_local;
  intptr_t bits_local;
  atomic<long> *pv_local;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  ulong local_20;
  atomic<long> **local_18;
  intptr_t local_10;
  
  v = wait_until_clear;
  wait_until_clear_local = bits;
  bits_local = (intptr_t)pv;
  do {
    iVar1 = bits_local;
    ___b = bits_local;
    local_44 = 0;
    local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_44 - 1U < 2) {
      pv_local = *(atomic<long> **)iVar1;
    }
    else if (local_44 == 5) {
      pv_local = *(atomic<long> **)iVar1;
    }
    else {
      pv_local = *(atomic<long> **)iVar1;
    }
    local_70 = pv_local;
    bVar2 = false;
    if ((((ulong)pv_local & wait_until_clear_local) != 0) &&
       (bVar2 = true, ((ulong)pv_local & v) == 0)) {
      local_30 = (ulong)pv_local & ~wait_until_clear_local;
      local_10 = bits_local;
      local_18 = &local_70;
      local_24 = 3;
      local_28 = 0;
      LOCK();
      paVar3 = *(atomic<long> **)bits_local;
      local_31 = pv_local == paVar3;
      if ((bool)local_31) {
        *(ulong *)bits_local = local_30;
        paVar3 = pv_local;
      }
      UNLOCK();
      if (!(bool)local_31) {
        local_70 = paVar3;
      }
      bVar2 = !(bool)local_31;
      local_20 = local_30;
    }
  } while (bVar2);
  return;
}

Assistant:

static void AtomicClearBits(std::atomic<intptr_t>* pv, intptr_t bits,
                            intptr_t wait_until_clear) {
  intptr_t v;
  do {
    v = pv->load(std::memory_order_relaxed);
  } while ((v & bits) != 0 &&
           ((v & wait_until_clear) != 0 ||
            !pv->compare_exchange_weak(v, v & ~bits,
                                       std::memory_order_release,
                                       std::memory_order_relaxed)));
}